

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

GLuint __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::BuildProgram
          (EnableDisableAttributesTest *this,char *vertex_shader,bool bind_even_or_odd)

{
  ostringstream *poVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  long *plVar7;
  undefined4 *puVar8;
  MessageBuilder *pMVar9;
  GLuint i;
  undefined7 in_register_00000011;
  uint uVar10;
  long lVar11;
  GLint status_1;
  Shader shader [2];
  GLint log_size;
  GLint status;
  GLchar *log_text_1;
  string attribute;
  int local_224;
  EnableDisableAttributesTest *local_220;
  char *local_218;
  int local_210 [2];
  char *local_208;
  undefined8 local_200;
  uint local_1f8;
  int local_1f4;
  string local_1f0;
  Enum<int,_2UL> local_1d0;
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar6;
  
  local_1f8 = (uint)CONCAT71(in_register_00000011,bind_even_or_odd);
  local_220 = this;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  local_210[0] = 0x8b31;
  local_210[1] = 0;
  local_208 = "#version 450\n\nout vec4 color;\n\nvoid main()\n{\n    color = vec4(1.0);}\n";
  local_200 = 0x8b30;
  local_218 = vertex_shader;
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x147);
  lVar11 = 0;
  do {
    if (*(long *)((long)&local_218 + lVar11) != 0) {
      uVar5 = (**(code **)(lVar6 + 0x3f0))(*(undefined4 *)((long)local_210 + lVar11));
      *(undefined4 *)((long)local_210 + lVar11 + 4) = uVar5;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x151);
      (**(code **)(lVar6 + 0x10))(GVar3,*(undefined4 *)((long)local_210 + lVar11 + 4));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x155);
      (**(code **)(lVar6 + 0x12b8))
                (*(undefined4 *)((long)local_210 + lVar11 + 4),1,
                 (char **)((long)&local_218 + lVar11),0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x159);
      (**(code **)(lVar6 + 0x248))(*(undefined4 *)((long)local_210 + lVar11 + 4));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x15d);
      local_224 = 0;
      (**(code **)(lVar6 + 0xa70))(*(undefined4 *)((long)local_210 + lVar11 + 4),0x8b81,&local_224);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x162);
      if (local_224 == 0) {
        local_1f4 = 0;
        (**(code **)(lVar6 + 0xa70))(*(undefined4 *)((long)local_210 + lVar11 + 4),0x8b84);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x168);
        iVar2 = local_1f4;
        local_1f0._M_dataplus._M_p = (pointer)operator_new__((long)local_1f4);
        (**(code **)(lVar6 + 0xa58))
                  (*(undefined4 *)((long)local_210 + lVar11 + 4),iVar2,0,local_1f0._M_dataplus._M_p)
        ;
        local_1b0._0_8_ = ((local_220->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation has failed.\n",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Shader type: ",0xd);
        local_1d0.m_value = *(int *)((long)local_210 + lVar11);
        local_1d0.m_getName = glu::getShaderTypeName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation error log:\n",0x1e);
        pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                   "Shader source code:\n",0x14);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char **)((long)&local_218 + lVar11));
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        if (local_1f0._M_dataplus._M_p != (pointer)0x0) {
          operator_delete__(local_1f0._M_dataplus._M_p);
        }
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x179);
        puVar8 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar8 = 0;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 == 0x10);
  (**(code **)(lVar6 + 0x14c8))(GVar3,1,&BuildProgram::xfb_varying,0x8c8c);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x184);
  uVar10 = local_1f8 & 0xff;
  if ((int)(local_1f8 & 0xff) < local_220->m_max_attributes) {
    do {
      local_1d0.m_getName = (GetNameFunc)local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"a_","");
      Utilities::itoa_abi_cxx11_(&local_1f0,(Utilities *)(ulong)uVar10,i);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char*>((string *)local_1b0,*plVar7,plVar7[1] + *plVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if (local_1d0.m_getName != (GetNameFunc)local_1c0) {
        operator_delete(local_1d0.m_getName,local_1c0[0] + 1);
      }
      (**(code **)(lVar6 + 0x38))(GVar3,uVar10,local_1b0._0_8_);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBindAttribLocation call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x18b);
      if ((TestLog *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
      uVar10 = uVar10 + 2;
    } while ((int)uVar10 < local_220->m_max_attributes);
  }
  (**(code **)(lVar6 + 0xce8))(GVar3);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x191);
  local_1f0._M_dataplus._M_p = (pointer)((ulong)local_1f0._M_dataplus._M_p._4_4_ << 0x20);
  (**(code **)(lVar6 + 0x9d8))(GVar3,0x8b82);
  if ((int)local_1f0._M_dataplus._M_p == 1) {
    lVar11 = 0;
    do {
      if (*(int *)((long)local_210 + lVar11 + 4) != 0) {
        (**(code **)(lVar6 + 0x4e0))(GVar3);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x19f);
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 == 0x10);
    lVar11 = 0xc;
    do {
      if (*(int *)((long)&local_218 + lVar11) != 0) {
        (**(code **)(lVar6 + 0x470))();
        *(undefined4 *)((long)&local_218 + lVar11) = 0;
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 == 0x1c);
    if (GVar3 != 0) {
      return GVar3;
    }
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  local_224 = 0;
  (**(code **)(lVar6 + 0x9d8))(GVar3,0x8b84);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1a9);
  iVar2 = local_224;
  local_1d0.m_getName = (GetNameFunc)operator_new__((long)local_224);
  (**(code **)(lVar6 + 0x988))(GVar3,iVar2,0,local_1d0.m_getName);
  local_1b0._0_8_ = ((local_220->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Program linkage has failed due to:\n",0x23);
  pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (local_1d0.m_getName != (GetNameFunc)0x0) {
    operator_delete__(local_1d0.m_getName);
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1b5);
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

glw::GLuint EnableDisableAttributesTest::BuildProgram(const char* vertex_shader, const bool bind_even_or_odd)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	glw::GLuint po = 0;

	try
	{
		/* Create program. */
		po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
														<< "Shader type: " << glu::getShaderTypeStr(shader[i].type)
														<< "\n"
														<< "Shader compilation error log:\n"
														<< log_text << "\n"
														<< "Shader source code:\n"
														<< shader[i].source << "\n"
														<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Transform Feedback setup. */
		static const glw::GLchar* xfb_varying = "sum";

		gl.transformFeedbackVaryings(po, 1, &xfb_varying, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		for (glw::GLint i = (glw::GLint)(bind_even_or_odd); i < m_max_attributes; i += 2)
		{
			std::string attribute = std::string("a_").append(Utilities::itoa(i));

			gl.bindAttribLocation(po, i, attribute.c_str());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindAttribLocation call failed.");
		}

		/* Link. */
		gl.linkProgram(po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (po)
		{
			gl.deleteProgram(po);

			po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == po)
	{
		throw 0;
	}

	return po;
}